

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UFS.h
# Opt level: O0

void __thiscall UFS::UFS(UFS *this,int N)

{
  undefined4 in_ESI;
  undefined4 *in_RDI;
  UFS *in_stack_ffffffffffffffe0;
  size_t in_stack_ffffffffffffffe8;
  
  *in_RDI = in_ESI;
  std::make_unique<int[]>(in_stack_ffffffffffffffe8);
  reset(in_stack_ffffffffffffffe0);
  return;
}

Assistant:

UFS(int N) : N(N), fa(std::make_unique<int[]>(N))
	{ reset(); }